

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

void __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::PushLabel
          (BinaryReaderInterp *this,Offset offset,Offset fixup_offset)

{
  pointer *ppLVar1;
  pointer __src;
  ulong uVar2;
  pointer pLVar3;
  Label LVar4;
  Label LVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 == (this->label_stack_).
                super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this->label_stack_).
            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)pLVar3 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar6 = (long)__n >> 3;
    uVar2 = 1;
    if (pLVar3 != __src) {
      uVar2 = uVar6;
    }
    uVar7 = uVar2 + uVar6;
    if (0xffffffffffffffe < uVar7) {
      uVar7 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar2,uVar6)) {
      uVar7 = 0xfffffffffffffff;
    }
    if (uVar7 == 0) {
      pLVar3 = (pointer)0x0;
    }
    else {
      pLVar3 = (pointer)operator_new(uVar7 * 8);
    }
    LVar4.fixup_offset = fixup_offset;
    LVar4.offset = offset;
    pLVar3[uVar6] = LVar4;
    if (0 < (long)__n) {
      memmove(pLVar3,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src);
    }
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar3;
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__n + 8 + (long)pLVar3);
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar3 + uVar7;
  }
  else {
    LVar5.fixup_offset = fixup_offset;
    LVar5.offset = offset;
    *pLVar3 = LVar5;
    ppLVar1 = &(this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  return;
}

Assistant:

void BinaryReaderInterp::PushLabel(Istream::Offset offset,
                                   Istream::Offset fixup_offset) {
  label_stack_.push_back(Label{offset, fixup_offset});
}